

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O2

void Gia_AigerWrite(Gia_Man_t *pInit,char *pFileName,int fWriteSymbols,int fCompact,
                   int fWriteNewLine)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  Gia_Man_t *p;
  Vec_Int_t *pVVar6;
  Vec_Str_t *pVVar7;
  uchar *pBuffer;
  Gia_Obj_t *pGVar8;
  float *pfVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  int v;
  
  if ((pInit->nXors != 0) || (pInit->nMuxes != 0)) {
    __assert_fail("pInit->nXors == 0 && pInit->nMuxes == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                  ,0x449,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
  }
  if (pInit->vCos->nSize == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Gia_AigerWrite(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar1 = Gia_ManIsNormalized(pInit);
  if (iVar1 == 0) {
    p = Gia_ManDupNormalize(pInit,0);
    Gia_ManTransferMapping(p,pInit);
    Gia_ManTransferPacking(p,pInit);
    Gia_ManTransferTiming(p,pInit);
    iVar1 = pInit->nConstrs;
    p->nConstrs = iVar1;
  }
  else {
    iVar1 = pInit->nConstrs;
    p = pInit;
  }
  pcVar14 = "2";
  if (fCompact == 0) {
    pcVar14 = "";
  }
  iVar3 = p->vCis->nSize;
  uVar2 = Gia_ManAndNum(p);
  uVar5 = p->nRegs;
  uVar11 = 0;
  if (iVar1 == 0) {
    uVar11 = (ulong)(p->vCos->nSize - uVar5);
  }
  fprintf(__stream,"aig%s %u %u %u %u %u",pcVar14,(ulong)(uVar2 + iVar3),(ulong)(iVar3 - uVar5),
          (ulong)uVar5,uVar11,(ulong)uVar2);
  if (p->nConstrs != 0) {
    fprintf(__stream," %u %u",(ulong)(uint)(p->vCos->nSize - (p->nRegs + p->nConstrs)));
  }
  fputc(10,__stream);
  Gia_ManInvertConstraints(p);
  if (fCompact == 0) {
    iVar1 = 0;
    while ((iVar1 < p->nRegs &&
           (pGVar8 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar1), pGVar8 != (Gia_Obj_t *)0x0)))
    {
      uVar5 = Gia_ObjFaninLit0p(p,pGVar8);
      fprintf(__stream,"%u\n",(ulong)uVar5);
      iVar1 = iVar1 + 1;
    }
    iVar1 = 0;
    while ((iVar1 < p->vCos->nSize - p->nRegs &&
           (pGVar8 = Gia_ManCo(p,iVar1), pGVar8 != (Gia_Obj_t *)0x0))) {
      uVar5 = Gia_ObjFaninLit0p(p,pGVar8);
      fprintf(__stream,"%u\n",(ulong)uVar5);
      iVar1 = iVar1 + 1;
    }
  }
  else {
    pVVar6 = Gia_AigerCollectLiterals(p);
    pVVar7 = Gia_AigerWriteLiterals(pVVar6);
    fwrite(pVVar7->pArray,1,(long)pVVar7->nSize,__stream);
    Vec_StrFree(pVVar7);
    Vec_IntFree(pVVar6);
  }
  Gia_ManInvertConstraints(p);
  iVar3 = Gia_ManAndNum(p);
  iVar1 = iVar3 * 8 + 100;
  pBuffer = (uchar *)malloc((long)iVar1);
  iVar16 = 0;
  v = 0;
  do {
    if ((p->nObjs <= v) || (pGVar8 = Gia_ManObj(p,v), pGVar8 == (Gia_Obj_t *)0x0)) {
      if (iVar1 <= iVar16) {
        __assert_fail("Pos < nBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                      ,0x49c,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
      }
      fwrite(pBuffer,1,(long)iVar16,__stream);
      free(pBuffer);
      if ((p->vNamesIn != (Vec_Ptr_t *)0x0) && (p->vNamesOut != (Vec_Ptr_t *)0x0)) {
        iVar1 = p->vNamesIn->nSize;
        if (iVar1 != p->vCis->nSize) {
          __assert_fail("Vec_PtrSize(p->vNamesIn) == Gia_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x4a5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        if (p->vNamesOut->nSize != p->vCos->nSize) {
          __assert_fail("Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x4a6,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        uVar5 = 0;
        while (((int)uVar5 < iVar1 - p->nRegs &&
               (pGVar8 = Gia_ManCi(p,uVar5), pGVar8 != (Gia_Obj_t *)0x0))) {
          Vec_PtrEntry(p->vNamesIn,uVar5);
          fprintf(__stream,"i%d %s\n",(ulong)uVar5);
          uVar5 = uVar5 + 1;
          iVar1 = p->vCis->nSize;
        }
        uVar5 = 0;
        while (((int)uVar5 < p->nRegs &&
               (pGVar8 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + uVar5),
               pGVar8 != (Gia_Obj_t *)0x0))) {
          Vec_PtrEntry(p->vNamesIn,(p->vCis->nSize - p->nRegs) + uVar5);
          fprintf(__stream,"l%d %s\n",(ulong)uVar5);
          uVar5 = uVar5 + 1;
        }
        uVar5 = 0;
        while (((int)uVar5 < p->vCos->nSize - p->nRegs &&
               (pGVar8 = Gia_ManCo(p,uVar5), pGVar8 != (Gia_Obj_t *)0x0))) {
          Vec_PtrEntry(p->vNamesOut,uVar5);
          fprintf(__stream,"o%d %s\n",(ulong)uVar5);
          uVar5 = uVar5 + 1;
        }
      }
      if (fWriteNewLine == 0) {
        fputc(99,__stream);
      }
      else {
        fwrite("c\n",2,1,__stream);
      }
      if (p->pAigExtra != (Gia_Man_t *)0x0) {
        fputc(0x61,__stream);
        pVVar7 = Gia_AigerWriteIntoMemoryStr(p->pAigExtra);
        iVar1 = pVVar7->nSize;
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        fwrite(pVVar7->pArray,1,(long)iVar1,__stream);
        Vec_StrFree(pVVar7);
      }
      if (p->nConstrs != 0) {
        fputc(99,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,4);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nConstrs);
      }
      if (p->nAnd2Delay != 0) {
        fputc(100,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,4);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nAnd2Delay);
      }
      if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
        pfVar9 = Tim_ManGetArrTimes((Tim_Man_t *)p->pManTime);
        if (pfVar9 != (float *)0x0) {
          fputc(0x69,__stream);
          iVar1 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1 * 4);
          iVar1 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
          fwrite(pfVar9,1,(long)(iVar1 << 2),__stream);
          free(pfVar9);
        }
        pfVar9 = Tim_ManGetReqTimes((Tim_Man_t *)p->pManTime);
        if (pfVar9 != (float *)0x0) {
          fputc(0x6f,__stream);
          iVar1 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar1 * 4);
          iVar1 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
          fwrite(pfVar9,1,(long)(iVar1 << 2),__stream);
          free(pfVar9);
        }
      }
      if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
        fputc(0x65,__stream);
        pVVar7 = Gia_WriteEquivClasses(p);
        Gia_FileWriteBufferSize((FILE *)__stream,pVVar7->nSize);
        fwrite(pVVar7->pArray,1,(long)pVVar7->nSize,__stream);
        Vec_StrFree(pVVar7);
      }
      if (p->vFlopClasses != (Vec_Int_t *)0x0) {
        fputc(0x66,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nRegs << 2);
        iVar1 = p->vFlopClasses->nSize;
        if (iVar1 != p->nRegs) {
          __assert_fail("Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x4f5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        fwrite(p->vFlopClasses->pArray,1,(long)iVar1 << 2,__stream);
      }
      if (p->vGateClasses != (Vec_Int_t *)0x0) {
        fputc(0x67,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nObjs << 2);
        iVar1 = p->vGateClasses->nSize;
        if (iVar1 != p->nObjs) {
          __assert_fail("Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x4fd,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        fwrite(p->vGateClasses->pArray,1,(long)iVar1 << 2,__stream);
      }
      if (p->pManTime != (void *)0x0) {
        fputc(0x68,__stream);
        pVVar7 = Tim_ManSave((Tim_Man_t *)p->pManTime,1);
        Gia_FileWriteBufferSize((FILE *)__stream,pVVar7->nSize);
        fwrite(pVVar7->pArray,1,(long)pVVar7->nSize,__stream);
        Vec_StrFree(pVVar7);
      }
      if (p->vPacking != (Vec_Int_t *)0x0) {
        fputc(0x6b,__stream);
        pVVar7 = Gia_WritePacking(p->vPacking);
        Gia_FileWriteBufferSize((FILE *)__stream,pVVar7->nSize);
        fwrite(pVVar7->pArray,1,(long)pVVar7->nSize,__stream);
        Vec_StrFree(pVVar7);
      }
      if (p->vEdge1 != (Vec_Int_t *)0x0) {
        pVVar6 = Gia_ManEdgeToArray(p);
        fputc(0x77,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,pVVar6->nSize * 4 + 4);
        Gia_FileWriteBufferSize((FILE *)__stream,pVVar6->nSize / 2);
        for (iVar1 = 0; iVar1 < pVVar6->nSize; iVar1 = iVar1 + 1) {
          iVar3 = Vec_IntEntry(pVVar6,iVar1);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar3);
        }
        Vec_IntFree(pVVar6);
      }
      if (p->vMapping != (Vec_Int_t *)0x0) {
        fputc(0x6d,__stream);
        pVVar7 = Gia_AigerWriteMappingDoc(p);
        Gia_FileWriteBufferSize((FILE *)__stream,pVVar7->nSize);
        fwrite(pVVar7->pArray,1,(long)pVVar7->nSize,__stream);
        Vec_StrFree(pVVar7);
      }
      if (p->pPlacement != (Gia_Plc_t *)0x0) {
        fputc(0x70,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nObjs << 2);
        fwrite(p->pPlacement,1,(long)p->nObjs << 2,__stream);
      }
      if (p->vRegClasses != (Vec_Int_t *)0x0) {
        fputc(0x72,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->vRegClasses->nSize * 4 + 4);
        Gia_FileWriteBufferSize((FILE *)__stream,p->vRegClasses->nSize);
        for (iVar1 = 0; iVar1 < p->vRegClasses->nSize; iVar1 = iVar1 + 1) {
          iVar3 = Vec_IntEntry(p->vRegClasses,iVar1);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar3);
        }
      }
      if (p->vRegInits != (Vec_Int_t *)0x0) {
        fputc(0x73,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->vRegInits->nSize * 4 + 4);
        Gia_FileWriteBufferSize((FILE *)__stream,p->vRegInits->nSize);
        for (iVar1 = 0; iVar1 < p->vRegInits->nSize; iVar1 = iVar1 + 1) {
          iVar3 = Vec_IntEntry(p->vRegInits,iVar1);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar3);
        }
      }
      if (p->vConfigs != (Vec_Int_t *)0x0) {
        fputc(0x62,__stream);
        if (p->pCellStr == (char *)0x0) {
          __assert_fail("p->pCellStr != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x54d,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        iVar1 = p->vConfigs->nSize;
        sVar10 = strlen(p->pCellStr);
        Gia_FileWriteBufferSize((FILE *)__stream,(int)sVar10 + iVar1 * 4 + 1);
        pcVar14 = p->pCellStr;
        sVar10 = strlen(pcVar14);
        fwrite(pcVar14,1,sVar10 + 1,__stream);
        for (iVar1 = 0; iVar1 < p->vConfigs->nSize; iVar1 = iVar1 + 1) {
          iVar3 = Vec_IntEntry(p->vConfigs,iVar1);
          Gia_FileWriteBufferSize((FILE *)__stream,iVar3);
        }
      }
      if (p->pSibls != (int *)0x0) {
        fputc(0x71,__stream);
        uVar13 = 0;
        uVar11 = (ulong)(uint)p->nObjs;
        if (p->nObjs < 1) {
          uVar11 = uVar13;
        }
        iVar1 = 0;
        for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
          uVar5 = 0;
          if (p->pSibls != (int *)0x0) {
            uVar5 = (uint)(0 < p->pSibls[uVar13]);
          }
          iVar1 = iVar1 + uVar5;
        }
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1 * 8 + 4);
        Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
        for (lVar15 = 0; lVar15 < p->nObjs; lVar15 = lVar15 + 1) {
          if ((p->pSibls != (int *)0x0) && (lVar12 = (long)p->pSibls[lVar15], lVar12 != 0)) {
            if (lVar15 <= lVar12) {
              __assert_fail("i > Gia_ObjSibl(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                            ,0x560,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
            }
            Gia_FileWriteBufferSize((FILE *)__stream,(int)lVar15);
            if (p->pSibls == (int *)0x0) {
              iVar1 = 0;
            }
            else {
              iVar1 = p->pSibls[lVar15];
            }
            Gia_FileWriteBufferSize((FILE *)__stream,iVar1);
          }
        }
      }
      if (p->pSwitching != (uchar *)0x0) {
        fputc(0x75,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nObjs);
        fwrite(p->pSwitching,1,(long)p->nObjs,__stream);
      }
      if (p->vObjClasses != (Vec_Int_t *)0x0) {
        fputc(0x76,__stream);
        Gia_FileWriteBufferSize((FILE *)__stream,p->nObjs << 2);
        iVar1 = p->vObjClasses->nSize;
        if (iVar1 != p->nObjs) {
          __assert_fail("Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x57d,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        fwrite(p->vObjClasses->pArray,1,(long)iVar1 << 2,__stream);
      }
      if (p->pName != (char *)0x0) {
        fputc(0x6e,__stream);
        sVar10 = strlen(p->pName);
        Gia_FileWriteBufferSize((FILE *)__stream,(int)sVar10 + 1);
        pcVar14 = p->pName;
        sVar10 = strlen(pcVar14);
        fwrite(pcVar14,1,sVar10,__stream);
        fputc(0,__stream);
      }
      if (fWriteNewLine != 0) {
        fwrite("c\n",2,1,__stream);
      }
      pcVar14 = Gia_TimeStamp();
      fprintf(__stream,"\nThis file was produced by the GIA package in ABC on %s\n",pcVar14);
      fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger"
             );
      fclose(__stream);
      if (p == pInit) {
        return;
      }
      Gia_ManTransferTiming(pInit,p);
LAB_001d180e:
      Gia_ManStop(p);
      return;
    }
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      iVar4 = Abc_Var2Lit(v,0);
      uVar5 = Abc_Var2Lit(v - (*(uint *)pGVar8 & 0x1fffffff),*(uint *)pGVar8 >> 0x1d & 1);
      uVar2 = (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20);
      uVar2 = Abc_Var2Lit(v - (uVar2 & 0x1fffffff),uVar2 >> 0x1d & 1);
      if (((p->fGiaSimple == 0) && (p->nBufs == 0)) && (uVar2 <= uVar5)) {
        __assert_fail("p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                      ,0x490,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
      }
      iVar16 = Gia_AigerWriteUnsignedBuffer(pBuffer,iVar16,iVar4 - uVar2);
      iVar16 = Gia_AigerWriteUnsignedBuffer(pBuffer,iVar16,uVar2 - uVar5);
      if (iVar3 * 8 + 0x5a < iVar16) {
        puts(
            "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small."
            );
        fclose(__stream);
        if (p == pInit) {
          return;
        }
        goto LAB_001d180e;
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_AigerWrite( Gia_Man_t * pInit, char * pFileName, int fWriteSymbols, int fCompact, int fWriteNewLine )
{
    int fVerbose = XAIG_VERBOSE;
    FILE * pFile;
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStrExt;
    int i, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;
    assert( pInit->nXors == 0 && pInit->nMuxes == 0 );

    if ( Gia_ManCoNum(pInit) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWrite(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // create normalized AIG
    if ( !Gia_ManIsNormalized(pInit) )
    {
//        printf( "Gia_AigerWrite(): Normalizing AIG for writing.\n" );
        p = Gia_ManDupNormalize( pInit, 0 );
        Gia_ManTransferMapping( p, pInit );
        Gia_ManTransferPacking( p, pInit );
        Gia_ManTransferTiming( p, pInit );
        p->nConstrs   = pInit->nConstrs;
    }
    else
        p = pInit;

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Gia_ManCiNum(p) + Gia_ManAndNum(p), 
        Gia_ManPiNum(p),
        Gia_ManRegNum(p),
        Gia_ManConstrNum(p) ? 0 : Gia_ManPoNum(p),
        Gia_ManAndNum(p) );
    // write the extended header "B C J F"
    if ( Gia_ManConstrNum(p) )
        fprintf( pFile, " %u %u", Gia_ManPoNum(p) - Gia_ManConstrNum(p), Gia_ManConstrNum(p) );
    fprintf( pFile, "\n" ); 

    Gia_ManInvertConstraints( p );
    if ( !fCompact ) 
    {
        // write latch drivers
        Gia_ManForEachRi( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
        // write PO drivers
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
    }
    else
    {
        Vec_Int_t * vLits = Gia_AigerCollectLiterals( p );
        Vec_Str_t * vBinary = Gia_AigerWriteLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Gia_ManInvertConstraints( p );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 8 * Gia_ManAndNum(p) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit  = Abc_Var2Lit( i, 0 );
        uLit0 = Gia_ObjFaninLit0( pObj, i );
        uLit1 = Gia_ObjFaninLit1( pObj, i );
        assert( p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit  - uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            if ( p != pInit )
                Gia_ManStop( p );
            return;
        }
    }
    assert( Pos < nBufferSize );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( p->vNamesIn && p->vNamesOut )
    {
        assert( Vec_PtrSize(p->vNamesIn)  == Gia_ManCiNum(p) );
        assert( Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p) );
        // write PIs
        Gia_ManForEachPi( p, pObj, i )
            fprintf( pFile, "i%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, i) );
        // write latches
        Gia_ManForEachRo( p, pObj, i )
            fprintf( pFile, "l%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, Gia_ManPiNum(p) + i) );
        // write POs
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "o%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesOut, i) );
    }

    // write the comment
    if ( fWriteNewLine ) 
        fprintf( pFile, "c\n" );
    else
        fprintf( pFile, "c" );

    // write additional AIG
    if ( p->pAigExtra )
    {
        fprintf( pFile, "a" );
        vStrExt = Gia_AigerWriteIntoMemoryStr( p->pAigExtra );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"a\".\n" );
    }
    // write constraints
    if ( p->nConstrs )
    {
        fprintf( pFile, "c" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nConstrs );
    }
    // write timing information
    if ( p->nAnd2Delay )
    {
        fprintf( pFile, "d" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nAnd2Delay );
    }
    if ( p->pManTime )
    {
        float * pTimes;
        pTimes = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "i" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"i\".\n" );
        }
        pTimes = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "o" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"o\".\n" );
        }
    }
    // write equivalences
    if ( p->pReprs && p->pNexts )
    {
        extern Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p );
        fprintf( pFile, "e" );
        vStrExt = Gia_WriteEquivClasses( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
    // write flop classes
    if ( p->vFlopClasses )
    {
        fprintf( pFile, "f" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManRegNum(p) );
        assert( Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p) );
        fwrite( Vec_IntArray(p->vFlopClasses), 1, 4*Gia_ManRegNum(p), pFile );
    }
    // write gate classes
    if ( p->vGateClasses )
    {
        fprintf( pFile, "g" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vGateClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write hierarchy info
    if ( p->pManTime )
    {
        fprintf( pFile, "h" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 1 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"h\".\n" );
    }
    // write packing
    if ( p->vPacking )
    {
        extern Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking );
        fprintf( pFile, "k" );
        vStrExt = Gia_WritePacking( p->vPacking );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"k\".\n" );
    }
    // write edges
    if ( p->vEdge1 )
    {
        Vec_Int_t * vPairs = Gia_ManEdgeToArray( p );
        int i;
        fprintf( pFile, "w" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(vPairs)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(vPairs)/2 );
        for ( i = 0; i < Vec_IntSize(vPairs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(vPairs, i) );
        Vec_IntFree( vPairs );
    }
    // write mapping
    if ( Gia_ManHasMapping(p) )
    {
        extern Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p );
        fprintf( pFile, "m" );
        vStrExt = Gia_AigerWriteMappingDoc( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"m\".\n" );
    }
    // write placement
    if ( p->pPlacement )
    {
        fprintf( pFile, "p" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        fwrite( p->pPlacement, 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write register classes
    if ( p->vRegClasses )
    {
        int i;
        fprintf( pFile, "r" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegClasses)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegClasses) );
        for ( i = 0; i < Vec_IntSize(p->vRegClasses); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegClasses, i) );
    }
    // write register inits
    if ( p->vRegInits )
    {
        int i;
        fprintf( pFile, "s" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegInits)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegInits) );
        for ( i = 0; i < Vec_IntSize(p->vRegInits); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegInits, i) );
    }
    // write configuration data
    if ( p->vConfigs )
    {
        fprintf( pFile, "b" );
        assert( p->pCellStr != NULL );
        Gia_FileWriteBufferSize( pFile, 4*Vec_IntSize(p->vConfigs) + strlen(p->pCellStr) + 1 );
        fwrite( p->pCellStr, 1, strlen(p->pCellStr) + 1, pFile );
//        fwrite( Vec_IntArray(p->vConfigs), 1, 4*Vec_IntSize(p->vConfigs), pFile );
        for ( i = 0; i < Vec_IntSize(p->vConfigs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vConfigs, i) );
    }
    // write choices
    if ( Gia_ManHasChoices(p) )
    {
        int i, nPairs = 0;
        fprintf( pFile, "q" );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            nPairs += (Gia_ObjSibl(p, i) > 0);
        Gia_FileWriteBufferSize( pFile, 4*(nPairs * 2 + 1) );
        Gia_FileWriteBufferSize( pFile, nPairs );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( Gia_ObjSibl(p, i) )
            {
                assert( i > Gia_ObjSibl(p, i) );
                Gia_FileWriteBufferSize( pFile, i );
                Gia_FileWriteBufferSize( pFile, Gia_ObjSibl(p, i) );
            }
        if ( fVerbose ) printf( "Finished writing extension \"q\".\n" );
    }
    // write switching activity
    if ( p->pSwitching )
    {
        fprintf( pFile, "u" );
        Gia_FileWriteBufferSize( pFile, Gia_ManObjNum(p) );
        fwrite( p->pSwitching, 1, Gia_ManObjNum(p), pFile );
    }
/*
    // write timing information
    if ( p->pManTime )
    {
        fprintf( pFile, "t" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 0 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
*/
    // write object classes
    if ( p->vObjClasses )
    {
        fprintf( pFile, "v" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vObjClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write name
    if ( p->pName )
    {
        fprintf( pFile, "n" );
        Gia_FileWriteBufferSize( pFile, strlen(p->pName)+1 );
        fwrite( p->pName, 1, strlen(p->pName), pFile );
        fprintf( pFile, "%c", '\0' );
    }
    // write comments
    if ( fWriteNewLine )
        fprintf( pFile, "c\n" );
    fprintf( pFile, "\nThis file was produced by the GIA package in ABC on %s\n", Gia_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
    if ( p != pInit )
    {
        Gia_ManTransferTiming( pInit, p );
        Gia_ManStop( p );
    }
}